

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3ff32::JSONParser::~JSONParser(JSONParser *this)

{
  pointer pSVar1;
  long lVar2;
  pointer pSVar3;
  
  std::__cxx11::string::~string((string *)&this->dict_key);
  pSVar1 = (this->stack).
           super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar3 = (this->stack).
                super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar3 != pSVar1; pSVar3 = pSVar3 + 1) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(pSVar3->item).m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pSVar3 = (this->stack).
           super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->stack).
                super__Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3;
  std::
  _Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
  ::_M_deallocate((_Vector_base<(anonymous_namespace)::JSONParser::StackFrame,_std::allocator<(anonymous_namespace)::JSONParser::StackFrame>_>
                   *)pSVar3,(pointer)(lVar2 / 0x18),lVar2 % 0x18);
  std::__cxx11::string::~string((string *)&this->token);
  return;
}

Assistant:

JSONParser(InputSource& is, JSON::Reactor* reactor) :
            is(is),
            reactor(reactor),
            p(buf)
        {
        }